

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O0

void __thiscall Diligent::SerializedShaderImpl::~SerializedShaderImpl(SerializedShaderImpl *this)

{
  SerializedShaderImpl *this_local;
  
  GetStatus(this,true);
  std::
  array<std::unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>,_7UL>
  ::~array(&this->m_Shaders);
  ShaderCreateInfoWrapper::~ShaderCreateInfoWrapper(&this->m_CreateInfo);
  ObjectBase<Diligent::ISerializedShader>::~ObjectBase
            (&this->super_ObjectBase<Diligent::ISerializedShader>);
  return;
}

Assistant:

SerializedShaderImpl::~SerializedShaderImpl()
{
    // Make sure that all asynchrous tasks are complete.
    GetStatus(/*WaitForCompletion = */ true);
}